

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

void ATyCPU(CUPDLPwork *w,cupdlp_float *aty,cupdlp_float *y)

{
  double dVar1;
  int iVar2;
  int iVar3;
  CUPDLPproblem *pCVar4;
  CUPDLPcsr *pCVar5;
  cupdlp_int *pcVar6;
  cupdlp_int *pcVar7;
  cupdlp_float *pcVar8;
  long lVar9;
  CUPDLPcsr *matrix;
  long lVar10;
  long lVar11;
  
  pCVar4 = w->problem;
  memset(aty,0,(long)pCVar4->data->nCols << 3);
  lVar9 = (long)pCVar4->data->nRows;
  if (0 < lVar9) {
    pCVar5 = w->problem->data->csr_matrix;
    pcVar6 = pCVar5->rowMatBeg;
    lVar10 = 0;
    do {
      iVar2 = pcVar6[lVar10];
      lVar11 = (long)iVar2;
      iVar3 = pcVar6[lVar10 + 1];
      if (iVar2 < iVar3) {
        dVar1 = y[lVar10];
        pcVar7 = pCVar5->rowMatIdx;
        pcVar8 = pCVar5->rowMatElem;
        do {
          aty[pcVar7[lVar11]] = pcVar8[lVar11] * dVar1 + aty[pcVar7[lVar11]];
          lVar11 = lVar11 + 1;
        } while (iVar3 != lVar11);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar9);
  }
  return;
}

Assistant:

void ATyCPU(CUPDLPwork *w, cupdlp_float *aty, const cupdlp_float *y) {
  // #if PDHG_USE_TIMERS
  //     ++w->timers->nAtyCalls;
  //     cupdlp_float dStartTime = getTimeStamp();
  // #endif

  CUPDLPproblem *lp = w->problem;

  /* no indentity currently
  FILL_ZERO(aty, lp->nSeq);

  // [A I]'*y
  for (cupdlp_int iSeq = ncols, iRow = 0; iSeq < lp->nSeq; ++iSeq, ++iRow)
  {
      ScatterRow(pdhg, iRow, y[iRow], aty);

      if ((pdhg->lower[iSeq] > -INFINITY) && (pdhg->upper[iSeq] < INFINITY))
      {
          aty[iSeq] = (scaling->rowScale ? scaling->rowScale[iRow] * y[iRow] :
  y[iRow]);
      }
      else
      {
          aty[iSeq] = 0.0;
      }
  }
  */

  memset(aty, 0, sizeof(cupdlp_float) * lp->data->nCols);
  for (cupdlp_int iRow = 0; iRow < lp->data->nRows; ++iRow) {
    ScatterRow(w, iRow, y[iRow], aty);
  }

  // #if PDHG_USE_TIMERS
  //     w->timers->dAtyTime += getTimeStamp() - dStartTime;
  // #endif
}